

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetFinalTripInductionNode
          (LoopDependenceAnalysis *this,Loop *loop,SENode *induction_coefficient)

{
  SENode *pSVar1;
  SENode *pSVar2;
  SENode *operand_2;
  SENode *trip_count;
  SENode *first_trip_induction_node;
  SENode *induction_coefficient_local;
  Loop *loop_local;
  LoopDependenceAnalysis *this_local;
  
  pSVar1 = GetFirstTripInductionNode(this,loop);
  if (pSVar1 == (SENode *)0x0) {
    this_local = (LoopDependenceAnalysis *)0x0;
  }
  else {
    pSVar2 = GetTripCount(this,loop);
    operand_2 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,1);
    pSVar2 = ScalarEvolutionAnalysis::CreateSubtraction(&this->scalar_evolution_,pSVar2,operand_2);
    pSVar2 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar2);
    pSVar2 = ScalarEvolutionAnalysis::CreateMultiplyNode
                       (&this->scalar_evolution_,pSVar2,induction_coefficient);
    pSVar1 = ScalarEvolutionAnalysis::CreateAddNode(&this->scalar_evolution_,pSVar1,pSVar2);
    this_local = (LoopDependenceAnalysis *)
                 ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar1);
  }
  return (SENode *)this_local;
}

Assistant:

SENode* LoopDependenceAnalysis::GetFinalTripInductionNode(
    const Loop* loop, SENode* induction_coefficient) {
  SENode* first_trip_induction_node = GetFirstTripInductionNode(loop);
  if (!first_trip_induction_node) {
    return nullptr;
  }
  // Get trip_count as GetTripCount - 1
  // This is because the induction variable is not stepped on the first
  // iteration of the loop
  SENode* trip_count =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateSubtraction(
          GetTripCount(loop), scalar_evolution_.CreateConstant(1)));
  // Return first_trip_induction_node + trip_count * induction_coefficient
  return scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateAddNode(
      first_trip_induction_node,
      scalar_evolution_.CreateMultiplyNode(trip_count, induction_coefficient)));
}